

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

shared_ptr<kratos::IfStmt> __thiscall kratos::Stmt::as<kratos::IfStmt>(Stmt *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<kratos::IfStmt> sVar1;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
            (local_28,(__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x68));
  std::static_pointer_cast<kratos::IfStmt,kratos::Stmt>((shared_ptr<kratos::Stmt> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  sVar1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<kratos::IfStmt>)
         sVar1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as() {
        return std::static_pointer_cast<T>(shared_from_this());
    }